

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void test_is_ipaddr(void)

{
  int iVar1;
  
  iVar1 = ptls_server_name_is_ipaddr("www.google.com");
  _ok((uint)((iVar1 != 0 ^ 0xffU) & 1),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x26);
  iVar1 = ptls_server_name_is_ipaddr("www.google.com.");
  _ok((uint)((iVar1 != 0 ^ 0xffU) & 1),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x27);
  iVar1 = ptls_server_name_is_ipaddr("www");
  _ok((uint)((iVar1 != 0 ^ 0xffU) & 1),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x28);
  iVar1 = ptls_server_name_is_ipaddr("");
  _ok((uint)((iVar1 != 0 ^ 0xffU) & 1),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x29);
  iVar1 = ptls_server_name_is_ipaddr("123");
  _ok((uint)((iVar1 != 0 ^ 0xffU) & 1),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2a);
  iVar1 = ptls_server_name_is_ipaddr("1.1.1.1");
  _ok(iVar1,"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2b);
  iVar1 = ptls_server_name_is_ipaddr("2001:db8::2:1");
  _ok(iVar1,"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2c);
  return;
}

Assistant:

static void test_is_ipaddr(void)
{
    ok(!ptls_server_name_is_ipaddr("www.google.com"));
    ok(!ptls_server_name_is_ipaddr("www.google.com."));
    ok(!ptls_server_name_is_ipaddr("www"));
    ok(!ptls_server_name_is_ipaddr(""));
    ok(!ptls_server_name_is_ipaddr("123"));
    ok(ptls_server_name_is_ipaddr("1.1.1.1"));
    ok(ptls_server_name_is_ipaddr("2001:db8::2:1"));
}